

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventThread.cpp
# Opt level: O1

void __thiscall EventThread::threadMain(EventThread *this)

{
  bool bVar1;
  Event *ev;
  
  do {
    ev = EventQueue::WaitEvent(&(this->super_EventDispatcher).mQueue,0);
    if (ev == (Event *)0x0) {
      jh_log_print(1,"void EventThread::threadMain()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventThread.cpp"
                   ,0x42,"got a null event\n");
    }
    bVar1 = EventDispatcher::handleEvent(&this->super_EventDispatcher,ev);
  } while (!bVar1);
  return;
}

Assistant:

void EventThread::threadMain()
{
	TRACE_BEGIN( LOG_LVL_NOTICE );
	Event *ev = NULL;
	bool done = false;
	
	while( !done )
	{
		LOG_INFO( "Waiting Event" );

		ev = mQueue.WaitEvent();

		LOG_NOISE( "Got Event" );
		
		if ( ev == NULL )
			LOG_ERR_FATAL( "got a null event\n" );
		
		// not needed, at this time.
		//AutoLock a( mLock );
		
		done = handleEvent( ev );
	}
}